

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_segment.cpp
# Opt level: O2

void __thiscall duckdb::ColumnSegment::~ColumnSegment(ColumnSegment *this)

{
  ::std::
  unique_ptr<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>_>::
  ~unique_ptr(&(this->segment_state).
               super_unique_ptr<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>_>
             );
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->block).internal.
              super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  BaseStatistics::~BaseStatistics(&(this->stats).statistics);
  LogicalType::~LogicalType(&this->type);
  return;
}

Assistant:

ColumnSegment::~ColumnSegment() {
}